

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetExportMacro(cmTarget *this)

{
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  string *psVar4;
  string local_98;
  undefined1 local_78 [8];
  string in;
  allocator local_41;
  string local_40;
  char *local_20;
  char *custom_export_name;
  cmTarget *this_local;
  
  custom_export_name = (char *)this;
  TVar2 = GetType(this);
  if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return (char *)0x0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"DEFINE_SYMBOL",&local_41);
  pcVar3 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    psVar4 = GetName_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_78,(string *)psVar4);
    std::__cxx11::string::operator+=((string *)local_78,"_EXPORTS");
    cmsys::SystemTools::MakeCindentifier(&local_98,(string *)local_78);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->ExportMacro,pcVar3);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  return pcVar3;
}

Assistant:

const char* cmTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if(this->GetType() == cmTarget::SHARED_LIBRARY ||
     this->GetType() == cmTarget::MODULE_LIBRARY ||
     this->IsExecutableWithExports())
    {
    if(const char* custom_export_name = this->GetProperty("DEFINE_SYMBOL"))
      {
      this->ExportMacro = custom_export_name;
      }
    else
      {
      std::string in = this->GetName();
      in += "_EXPORTS";
      this->ExportMacro = cmSystemTools::MakeCindentifier(in);
      }
    return this->ExportMacro.c_str();
    }
  else
    {
    return 0;
    }
}